

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O3

void __thiscall depspawn::internal::ThreadPool::resize(ThreadPool *this,int new_nthreads)

{
  int iVar1;
  domain_error *this_00;
  ulong uVar2;
  ThreadPool *local_48;
  code *local_40;
  undefined8 local_38;
  
  uVar2 = (ulong)(uint)new_nthreads;
  if (new_nthreads < 0) {
    iVar1 = std::thread::hardware_concurrency();
    uVar2 = (ulong)(uint)(new_nthreads + iVar1);
    if (new_nthreads + iVar1 < 0) {
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error(this_00,"Negative number of threads");
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  do {
    do {
    } while (this->ready_ != false);
  } while (this->count_ != 0);
  if ((ulong)((long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar2) {
    do {
      local_40 = main;
      local_38 = 0;
      local_48 = this;
      std::vector<std::thread,std::allocator<std::thread>>::
      emplace_back<void(depspawn::internal::ThreadPool::*)(),depspawn::internal::ThreadPool*>
                ((vector<std::thread,std::allocator<std::thread>> *)this,
                 (offset_in_ThreadPool_to_subr *)&local_40,&local_48);
    } while ((ulong)((long)(this->threads_).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->threads_).
                           super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) < uVar2);
  }
  this->nthreads_in_use_ = (int)uVar2;
  return;
}

Assistant:

void resize(int new_nthreads)
  {

    if(new_nthreads < 0 ) {
      new_nthreads += static_cast<int>(std::thread::hardware_concurrency());
      if (new_nthreads < 0) {
        throw std::domain_error("Negative number of threads");
      }
    }

    wait();

    // can only grow
    while (threads_.size() < static_cast<size_t>(new_nthreads)) {
      threads_.emplace_back(&ThreadPool::main, this);
    }
    nthreads_in_use_ = new_nthreads;
  }